

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

int clamp_iframe_target_size(AV1_COMP *cpi,int64_t target)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(cpi->oxcf).rc_cfg.max_intra_bitrate_pct;
  if (uVar3 != 0) {
    lVar2 = (long)((long)(cpi->rc).avg_frame_bandwidth * uVar3) / 100;
    if (lVar2 < target) {
      target = lVar2;
    }
  }
  iVar1 = (cpi->rc).max_frame_bandwidth;
  if (target < iVar1) {
    iVar1 = (int)target;
  }
  return iVar1;
}

Assistant:

static int clamp_iframe_target_size(const AV1_COMP *const cpi, int64_t target) {
  const RATE_CONTROL *rc = &cpi->rc;
  const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;
  if (rc_cfg->max_intra_bitrate_pct) {
    const int64_t max_rate =
        (int64_t)rc->avg_frame_bandwidth * rc_cfg->max_intra_bitrate_pct / 100;
    target = AOMMIN(target, max_rate);
  }
  if (target > rc->max_frame_bandwidth) target = rc->max_frame_bandwidth;
  return (int)target;
}